

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_ostream.cpp
# Opt level: O0

raw_ostream * write_padding<(char)32>(raw_ostream *OS,uint NumChars)

{
  size_t __n;
  size_t sVar1;
  uint *puVar2;
  uint local_24;
  uint local_20;
  uint local_1c;
  uint NumToWrite;
  uint NumChars_local;
  raw_ostream *OS_local;
  
  local_1c = NumChars;
  _NumToWrite = OS;
  __n = llvm::array_lengthof<char_const,80ul>
                  ((char (*) [80])
                   "                                                                                "
                  );
  if (NumChars < __n) {
    OS_local = (raw_ostream *)
               llvm::raw_ostream::write(_NumToWrite,0x2986f50,(void *)(ulong)local_1c,__n);
  }
  else {
    for (; local_1c != 0; local_1c = local_1c - local_20) {
      sVar1 = llvm::array_lengthof<char_const,80ul>
                        ((char (*) [80])
                         "                                                                                "
                        );
      local_24 = (int)sVar1 - 1;
      puVar2 = std::min<unsigned_int>(&local_1c,&local_24);
      local_20 = *puVar2;
      llvm::raw_ostream::write(_NumToWrite,0x2986f50,(void *)(ulong)local_20,__n);
      __n = (size_t)local_20;
    }
    OS_local = _NumToWrite;
  }
  return OS_local;
}

Assistant:

static raw_ostream &write_padding(raw_ostream &OS, unsigned NumChars) {
  static const char Chars[] = {C, C, C, C, C, C, C, C, C, C, C, C, C, C, C, C,
                               C, C, C, C, C, C, C, C, C, C, C, C, C, C, C, C,
                               C, C, C, C, C, C, C, C, C, C, C, C, C, C, C, C,
                               C, C, C, C, C, C, C, C, C, C, C, C, C, C, C, C,
                               C, C, C, C, C, C, C, C, C, C, C, C, C, C, C, C};

  // Usually the indentation is small, handle it with a fastpath.
  if (NumChars < array_lengthof(Chars))
    return OS.write(Chars, NumChars);

  while (NumChars) {
    unsigned NumToWrite = std::min(NumChars,
                                   (unsigned)array_lengthof(Chars)-1);
    OS.write(Chars, NumToWrite);
    NumChars -= NumToWrite;
  }
  return OS;
}